

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * mg_fgets(char *buf,size_t size,mg_file *filep)

{
  mg_file *filep_local;
  size_t size_local;
  char *buf_local;
  
  if (filep == (mg_file *)0x0) {
    buf_local = (char *)0x0;
  }
  else if ((filep->access).fp == (FILE *)0x0) {
    buf_local = (char *)0x0;
  }
  else {
    buf_local = fgets(buf,(int)size,(FILE *)(filep->access).fp);
  }
  return buf_local;
}

Assistant:

static const char *
mg_fgets(char *buf, size_t size, struct mg_file *filep)
{
	if (!filep) {
		return NULL;
	}

	if (filep->access.fp != NULL) {
		return fgets(buf, (int)size, filep->access.fp);
	} else {
		return NULL;
	}
}